

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmStringLiteral(ExpressionContext *ctx,VmModule *module,ExprStringLiteral *node)

{
  uint size_00;
  int iVar1;
  undefined4 extraout_var;
  VmConstant *value_01;
  VmValue *pVVar2;
  uint local_34;
  uint i;
  char *value;
  uint size;
  ExprStringLiteral *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  char *value_00;
  
  size_00 = node->length + 4 & 0xfffffffc;
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
  value_00 = (char *)CONCAT44(extraout_var,iVar1);
  memset(value_00,0,(ulong)size_00);
  for (local_34 = 0; local_34 < node->length; local_34 = local_34 + 1) {
    value_00[local_34] = node->value[local_34];
  }
  value_01 = CreateConstantStruct
                       (module->allocator,(node->super_ExprBase).source,value_00,size_00,
                        (node->super_ExprBase).type);
  pVVar2 = anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,&value_01->super_VmValue);
  return pVVar2;
}

Assistant:

VmValue* CompileVmStringLiteral(ExpressionContext &ctx, VmModule *module, ExprStringLiteral *node)
{
	unsigned size = node->length + 1;

	// Align to 4
	size = (size + 3) & ~3;

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	for(unsigned i = 0; i < node->length; i++)
		value[i] = node->value[i];

	return CheckType(ctx, node, CreateConstantStruct(module->allocator, node->source, value, size, node->type));
}